

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O1

void Test_TemplateModifiers_AddModifier::Run(void)

{
  char cVar1;
  long lVar2;
  undefined8 extraout_RAX;
  NullModifier foo_modifier;
  code *local_10;
  
  cVar1 = ctemplate::AddModifier("x-atest",(TemplateModifier *)&ctemplate::html_escape);
  if (cVar1 == '\0') {
    Run();
LAB_00114e01:
    Run();
LAB_00114e06:
    Run();
LAB_00114e0b:
    Run();
LAB_00114e10:
    Run();
LAB_00114e15:
    Run();
LAB_00114e1a:
    Run();
LAB_00114e1f:
    Run();
LAB_00114e24:
    Run();
LAB_00114e29:
    Run();
LAB_00114e2e:
    Run();
LAB_00114e33:
    Run();
LAB_00114e38:
    Run();
LAB_00114e3d:
    Run();
LAB_00114e42:
    Run();
LAB_00114e47:
    Run();
LAB_00114e4c:
    Run();
  }
  else {
    cVar1 = ctemplate::AddModifier("x-atest-arg=",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 == '\0') goto LAB_00114e01;
    cVar1 = ctemplate::AddModifier("x-atest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 == '\0') goto LAB_00114e06;
    cVar1 = ctemplate::AddModifier("x-atest-arg=html",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 == '\0') goto LAB_00114e0b;
    cVar1 = ctemplate::AddModifier("x-atest-arg=json",(TemplateModifier *)&ctemplate::json_escape);
    if (cVar1 == '\0') goto LAB_00114e10;
    cVar1 = ctemplate::AddModifier("x-atest-arg=j",(TemplateModifier *)&ctemplate::json_escape);
    if (cVar1 == '\0') goto LAB_00114e15;
    cVar1 = ctemplate::AddModifier("x-atest-arg=J",(TemplateModifier *)&ctemplate::json_escape);
    if (cVar1 == '\0') goto LAB_00114e1a;
    cVar1 = ctemplate::AddModifier("test",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 != '\0') goto LAB_00114e1f;
    cVar1 = ctemplate::AddModifier("x-atest",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 != '\0') goto LAB_00114e24;
    cVar1 = ctemplate::AddModifier("x-atest-arg=",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 != '\0') goto LAB_00114e29;
    cVar1 = ctemplate::AddModifier("x-atest-arg=h",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 != '\0') goto LAB_00114e2e;
    cVar1 = ctemplate::AddModifier("x-atest-arg=html",(TemplateModifier *)&ctemplate::html_escape);
    if (cVar1 != '\0') goto LAB_00114e33;
    lVar2 = ctemplate::FindModifier("x-atest",7,"",0);
    if (lVar2 == 0) goto LAB_00114e38;
    if (*(char *)(lVar2 + 0x21) == '\x01') goto LAB_00114e3d;
    lVar2 = ctemplate::FindModifier("x-foo",5,"",0);
    if (lVar2 == 0) goto LAB_00114e42;
    if (*(char *)(lVar2 + 0x22) == '\x01') goto LAB_00114e47;
    local_10 = ctemplate::GetDefaultModifierForXml;
    cVar1 = ctemplate::AddModifier("x-foo",(TemplateModifier *)&local_10);
    if (cVar1 == '\0') goto LAB_00114e4c;
    lVar2 = ctemplate::FindModifier("x-foo",5,"",0);
    if (lVar2 != 0) {
      if (*(TemplateModifier **)(lVar2 + 0x28) == (TemplateModifier *)&local_10) {
        ctemplate::TemplateModifier::~TemplateModifier((TemplateModifier *)&local_10);
        return;
      }
      goto LAB_00114e56;
    }
  }
  Run();
LAB_00114e56:
  Run();
  ctemplate::TemplateModifier::~TemplateModifier((TemplateModifier *)&local_10);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(TemplateModifiers, AddModifier) {
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=h", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=html", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=json", &GOOGLE_NAMESPACE::json_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=j", &GOOGLE_NAMESPACE::json_escape));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=J", &GOOGLE_NAMESPACE::json_escape));

  // Make sure AddModifier fails with an invalid name.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("test", &GOOGLE_NAMESPACE::html_escape));

  // Make sure AddModifier fails with a duplicate name.
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-atest", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=h", &GOOGLE_NAMESPACE::html_escape));
  EXPECT_FALSE(GOOGLE_NAMESPACE::AddModifier("x-atest-arg=html", &GOOGLE_NAMESPACE::html_escape));

  const GOOGLE_NAMESPACE::ModifierInfo* info;
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-atest", 7, "", 0)));
  EXPECT_FALSE(info->modval_required);

  // Make sure we can still add a modifier after having already
  // searched for it.
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-foo", 5, "", 0)));
  EXPECT_FALSE(info->is_registered);

  GOOGLE_NAMESPACE::NullModifier foo_modifier;
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-foo", &foo_modifier));
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-foo", 5, "", 0)));
  EXPECT_EQ(info->modifier, &foo_modifier);
}